

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O1

Nullable<CordRep_*>
absl::lts_20250127::NewTree(Nullable<const_char_*> data,size_t length,size_t alloc_hint)

{
  byte bVar1;
  Nullable<CordRep_*> pCVar2;
  CordRep *rep;
  CordRep *pCVar3;
  CordRepBtree *pCVar4;
  uint8_t uVar5;
  size_t in_R8;
  string_view data_00;
  
  if (length == 0) {
    return (Nullable<CordRep_*>)0x0;
  }
  if (length < 0xff4) {
    pCVar2 = &cord_internal::CordRepFlat::NewImpl<4096ul>(length)->super_CordRep;
    ((CordRep *)&pCVar2->length)->length = length;
    memcpy(pCVar2->storage,data,length);
    return pCVar2;
  }
  rep = &cord_internal::CordRepFlat::NewImpl<4096ul>(0xff3)->super_CordRep;
  rep->length = 0xff3;
  memcpy(rep->storage,data,0xff3);
  bVar1 = rep->tag;
  if (bVar1 < 5) {
    pCVar3 = rep;
    if (bVar1 == 1) {
      pCVar3 = *(CordRep **)&rep[1].refcount;
    }
    if (pCVar3->tag < 5) {
      pCVar4 = cord_internal::CordRepBtree::CreateSlow(rep);
      goto LAB_004a7b04;
    }
  }
  pCVar4 = (CordRepBtree *)operator_new(0x40);
  (pCVar4->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
  if (bVar1 == 3) {
    uVar5 = rep->storage[0] + '\x01';
  }
  else {
    uVar5 = '\0';
  }
  (pCVar4->super_CordRep).length = rep->length;
  (pCVar4->super_CordRep).tag = '\x03';
  (pCVar4->super_CordRep).storage[0] = uVar5;
  (pCVar4->super_CordRep).storage[1] = '\0';
  (pCVar4->super_CordRep).storage[2] = '\x01';
  pCVar4->edges_[0] = rep;
LAB_004a7b04:
  data_00._M_str = (char *)0x0;
  data_00._M_len = (size_t)(data + 0xff3);
  pCVar4 = cord_internal::CordRepBtree::Append
                     (pCVar4,(CordRepBtree *)(length - 0xff3),data_00,in_R8);
  return &pCVar4->super_CordRep;
}

Assistant:

static absl::Nullable<CordRep*> NewTree(absl::Nullable<const char*> data,
                                        size_t length, size_t alloc_hint) {
  if (length == 0) return nullptr;
  return NewBtree(data, length, alloc_hint);
}